

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void ctemplate_htmlparser::Test_Htmlparser_Error::Run(void)

{
  long lVar1;
  char *__s1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  HtmlParser html;
  HtmlParser local_38;
  char *local_30;
  int local_28;
  char local_20 [16];
  
  HtmlParser::HtmlParser(&local_38);
  lVar1 = ctemplate_htmlparser::htmlparser_get_error_msg(local_38.parser_);
  if (lVar1 == 0) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"<a href=\'http://www.google.com\' \'\'>\n","");
    iVar2 = ctemplate_htmlparser::htmlparser_parse(local_38.parser_,local_30,local_28);
    if (local_30 != local_20) {
      operator_delete(local_30);
    }
    if (iVar2 != 7) goto LAB_00107ff5;
    __s1 = (char *)ctemplate_htmlparser::htmlparser_get_error_msg(local_38.parser_);
    iVar2 = strcmp(__s1,"Unexpected character \'\\\'\' in state \'tag_space\'");
    if (iVar2 == 0) {
      ctemplate_htmlparser::htmlparser_reset(local_38.parser_);
      lVar1 = ctemplate_htmlparser::htmlparser_get_error_msg(local_38.parser_);
      if (lVar1 == 0) {
        ctemplate_htmlparser::htmlparser_delete(local_38.parser_);
        return;
      }
      goto LAB_00107fff;
    }
  }
  else {
    Run();
LAB_00107ff5:
    Run();
  }
  Run();
LAB_00107fff:
  Run();
  __clang_call_terminate(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

TEST(Htmlparser, Error) {
  HtmlParser html;

  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
  EXPECT_EQ(html.Parse("<a href='http://www.google.com' ''>\n"),
            HtmlParser::STATE_ERROR);

  EXPECT_STREQ(html.GetErrorMessage(),
               "Unexpected character '\\'' in state 'tag_space'");
  html.Reset();
  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
}